

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

BilinearPatchMesh *
pbrt::BilinearPatch::CreateMesh
          (Transform *renderFromObject,bool reverseOrientation,ParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long lVar3;
  Allocator alloc_00;
  undefined4 extraout_var;
  BilinearPatchMesh *p;
  ulong uVar4;
  pointer v;
  ulong uVar5;
  char *message;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  span<const_float> func;
  bool reverseOrientation_local;
  Allocator alloc_local;
  vector<int,_std::allocator<int>_> local_358;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> P;
  Array2D<float> d;
  PiecewiseConstant2D *imageDist;
  vector<int,_std::allocator<int>_> faceIndices;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> N;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  string filename;
  string local_298;
  string ret;
  polymorphic_allocator<unsigned_char> local_1c0;
  uchar *local_1b8;
  size_t local_1b0;
  polymorphic_allocator<pbrt::Half> local_1a0;
  Half *local_198;
  size_t local_190;
  polymorphic_allocator<float> local_180;
  float *local_178;
  size_t local_170;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_90;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  ColorEncodingHandle local_38;
  undefined4 extraout_var_00;
  
  paVar1 = &ret.field_2;
  ret._M_string_length = (size_type)ret._M_dataplus._M_p;
  reverseOrientation_local = reverseOrientation;
  alloc_local = alloc;
  ret._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"indices","");
  ParameterDictionary::GetIntArray(&local_358,parameters,&ret);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ret._M_dataplus._M_p != paVar1) {
    operator_delete(ret._M_dataplus._M_p,
                    CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]) +
                    1);
  }
  ret._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"P","");
  ParameterDictionary::GetPoint3fArray(&P,parameters,&ret);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ret._M_dataplus._M_p != paVar1) {
    operator_delete(ret._M_dataplus._M_p,
                    CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]) +
                    1);
  }
  ret._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"uv","");
  ParameterDictionary::GetPoint2fArray(&uv,parameters,&ret);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ret._M_dataplus._M_p != paVar1) {
    operator_delete(ret._M_dataplus._M_p,
                    CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]) +
                    1);
  }
  if (local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if ((long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x30) {
      ret._0_16_ = vpmovsxbd_avx(ZEXT416(0x3020100));
      std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                ((vector<int,std::allocator<int>> *)&local_358,&ret);
      goto LAB_0040fc9a;
    }
    message = "Vertex indices \"indices\" must be provided with bilinear patch mesh shape.";
  }
  else {
    if (((long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start & 0xcU) != 0) {
      filename._M_dataplus._M_p._0_4_ =
           (undefined4)
           ((ulong)((long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
      ret._M_string_length = 0;
      ret._M_dataplus._M_p = (pointer)paVar1;
      ret.field_2._M_local_buf[0] = '\0';
      d.extent.pMin.super_Tuple2<pbrt::Point2,_int> =
           (Tuple2<pbrt::Point2,_int>)
           (CONCAT44(d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y,filename._M_dataplus._M_p._0_4_
                    ) & 0xffffffff00000003);
      detail::stringPrintfRecursive<int,int>
                (&ret,"Number of vertex indices %d not a multiple of 4. Discarding %d excess.",
                 (int *)&filename,(int *)&d);
      Error(loc,ret._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p != paVar1) {
        operator_delete(ret._M_dataplus._M_p,
                        CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]
                                ) + 1);
      }
      if (((int)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
           (int)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start & 0xcU) != 0) {
        uVar4 = (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        do {
          uVar4 = uVar4 - 4;
          local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
        } while ((uVar4 & 0xc) != 0);
      }
    }
LAB_0040fc9a:
    if (P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
        super__Vector_impl_data._M_start !=
        P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl
           .super__Vector_impl_data._M_start !=
           uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl
           .super__Vector_impl_data._M_finish) &&
         ((long)uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 !=
          ((long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)) {
        Error(loc,"Number of \"uv\"s for bilinear patch mesh must match \"P\"s. Discarding uvs.");
        std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
        _M_assign_aux<pbrt::Point2<float>const*>
                  ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&uv,0,0);
      }
      ret._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"N","");
      ParameterDictionary::GetNormal3fArray(&N,parameters,&ret);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p != paVar1) {
        operator_delete(ret._M_dataplus._M_p,
                        CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]
                                ) + 1);
      }
      if ((N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         ((long)N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start !=
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start)) {
        Error(loc,"Number of \"N\"s for bilinear patch mesh must match \"P\"s. Discarding \"N\"s.");
        std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>::
        _M_assign_aux<pbrt::Normal3<float>const*>
                  ((vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>> *)&N,0,0);
      }
      if ((long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar3 = (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        uVar4 = ((long)P.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)P.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        lVar3 = lVar3 + (ulong)(lVar3 == 0);
        v = local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
        do {
          if (uVar4 < (ulong)(long)*v || uVar4 - (long)*v == 0) {
            ret._M_string_length = 0;
            ret._M_dataplus._M_p = (pointer)paVar1;
            filename._M_dataplus._M_p._0_4_ = (undefined4)uVar4;
            ret.field_2._M_local_buf[0] = '\0';
            detail::stringPrintfRecursive<int&,int>
                      (&ret,
                       "Bilinear patch mesh has out of-bounds vertex index %d (%d \"P\" values were given. Discarding this mesh."
                       ,v,(int *)&filename);
            Error(loc,ret._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)ret._M_dataplus._M_p != paVar1) {
              operator_delete(ret._M_dataplus._M_p,
                              CONCAT71(ret.field_2._M_allocated_capacity._1_7_,
                                       ret.field_2._M_local_buf[0]) + 1);
            }
            p = (BilinearPatchMesh *)0x0;
            goto LAB_0041030d;
          }
          v = v + 1;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
      ret._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"faceIndices","");
      ParameterDictionary::GetIntArray(&faceIndices,parameters,&ret);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p != paVar1) {
        operator_delete(ret._M_dataplus._M_p,
                        CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]
                                ) + 1);
      }
      if (faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        uVar4 = (long)faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        uVar5 = (ulong)((long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2) >> 2;
        if (uVar4 != uVar5) {
          ret._M_string_length = 0;
          ret._M_dataplus._M_p = (pointer)paVar1;
          filename._M_dataplus._M_p._0_4_ = (undefined4)uVar4;
          d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar5;
          ret.field_2._M_local_buf[0] = '\0';
          detail::stringPrintfRecursive<int,int>
                    (&ret,
                     "Number of face indices %d does not match number of bilinear patches %d. Discarding face indices."
                     ,(int *)&filename,(int *)&d);
          Error(loc,ret._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)ret._M_dataplus._M_p != paVar1) {
            operator_delete(ret._M_dataplus._M_p,
                            CONCAT71(ret.field_2._M_allocated_capacity._1_7_,
                                     ret.field_2._M_local_buf[0]) + 1);
          }
          std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                    ((vector<int,std::allocator<int>> *)&faceIndices,0,0);
        }
      }
      d.extent.pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)&d.allocator;
      std::__cxx11::string::_M_construct<char_const*>((string *)&d,"emissionfilename","");
      local_298._M_dataplus._M_p = (pointer)((long)&local_298 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
      ParameterDictionary::GetOneString(&ret,parameters,(string *)&d,&local_298);
      ResolveFilename(&filename,&ret);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p != paVar1) {
        operator_delete(ret._M_dataplus._M_p,
                        CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]
                                ) + 1);
      }
      if (local_298._M_dataplus._M_p != (pointer)((long)&local_298 + 0x10)) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (d.extent.pMin.super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)&d.allocator)
      {
        operator_delete((void *)d.extent.pMin.super_Tuple2<pbrt::Point2,_int>,
                        (ulong)((long)&(d.allocator.memoryResource)->_vptr_memory_resource + 1));
      }
      imageDist = (PiecewiseConstant2D *)0x0;
      if (filename._M_string_length != 0) {
        local_38.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )0;
        Image::Read((ImageAndMetadata *)&ret,&filename,alloc_local,&local_38);
        auVar7._8_4_ = 0x3f800000;
        auVar7._0_8_ = 0x3f8000003f800000;
        auVar7._12_4_ = 0x3f800000;
        local_58 = (_Any_data)0x0;
        local_40 = std::
                   _Function_handler<float_(pbrt::Point2<float>),_pbrt::Image::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h:398:46)>
                   ::_M_invoke;
        local_48 = std::
                   _Function_handler<float_(pbrt::Point2<float>),_pbrt::Image::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.h:398:46)>
                   ::_M_manager;
        local_298._0_16_ = vpunpcklqdq_avx((undefined1  [16])0x0,auVar7);
        alloc_00.memoryResource = pstd::pmr::new_delete_resource();
        Image::GetSamplingDistribution
                  (&d,(Image *)&ret,(function<float_(pbrt::Point2<float>)> *)&local_58,
                   (Bounds2f *)&local_298,alloc_00);
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,__destroy_functor);
        }
        iVar2 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                          (alloc_local.memoryResource,0x80,8);
        auVar6._8_8_ = 0;
        auVar6._0_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
        auVar6._4_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
        auVar8._8_8_ = 0;
        auVar8._0_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
        auVar8._4_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
        auVar7 = vpsubd_avx(auVar6,auVar8);
        func.n = (size_t)(auVar7._4_4_ * auVar7._0_4_);
        func.ptr = d.values;
        PiecewiseConstant2D::PiecewiseConstant2D
                  ((PiecewiseConstant2D *)CONCAT44(extraout_var,iVar2),func,auVar7._0_4_,
                   auVar7._4_4_,(Bounds2f)(ZEXT816(0x3f8000003f800000) << 0x40),alloc_local);
        imageDist = (PiecewiseConstant2D *)CONCAT44(extraout_var,iVar2);
        Array2D<float>::~Array2D(&d);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&local_90);
        (*(local_180.memoryResource)->_vptr_memory_resource[3])
                  (local_180.memoryResource,local_178,local_170 << 2,4);
        (*(local_1a0.memoryResource)->_vptr_memory_resource[3])
                  (local_1a0.memoryResource,local_198,local_190 * 2,2);
        (*(local_1c0.memoryResource)->_vptr_memory_resource[3])
                  (local_1c0.memoryResource,local_1b8,local_1b0,1);
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&ret.field_2);
      }
      iVar2 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                        (alloc_local.memoryResource,0x40,8);
      p = (BilinearPatchMesh *)CONCAT44(extraout_var_00,iVar2);
      pstd::pmr::polymorphic_allocator<std::byte>::
      construct<pbrt::BilinearPatchMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>,pbrt::PiecewiseConstant2D*&>
                (&alloc_local,p,renderFromObject,&reverseOrientation_local,&local_358,&P,&N,&uv,
                 &faceIndices,&imageDist);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(filename._M_dataplus._M_p._4_4_,filename._M_dataplus._M_p._0_4_) !=
          &filename.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(filename._M_dataplus._M_p._4_4_,filename._M_dataplus._M_p._0_4_),
                        filename.field_2._M_allocated_capacity + 1);
      }
      if (faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
LAB_0041030d:
      if (N.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(N.
                        super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)N.
                              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)N.
                              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0041032a;
    }
    message = "Vertex positions \"P\" must be provided with bilinear patch mesh shape.";
  }
  Error(loc,message);
  p = (BilinearPatchMesh *)0x0;
LAB_0041032a:
  if (uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(uv.
                    super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)uv.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)uv.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(P.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)P.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)P.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return p;
}

Assistant:

BilinearPatchMesh *BilinearPatch::CreateMesh(const Transform *renderFromObject,
                                             bool reverseOrientation,
                                             const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    std::vector<int> vertexIndices = parameters.GetIntArray("indices");
    std::vector<Point3f> P = parameters.GetPoint3fArray("P");
    std::vector<Point2f> uv = parameters.GetPoint2fArray("uv");

    if (vertexIndices.empty()) {
        if (P.size() == 4)
            // single patch
            vertexIndices = {0, 1, 2, 3};
        else {
            Error(loc, "Vertex indices \"indices\" must be provided with "
                       "bilinear patch mesh shape.");
            return {};
        }
    } else if ((vertexIndices.size() % 4) != 0u) {
        Error(loc,
              "Number of vertex indices %d not a multiple of 4. Discarding %d "
              "excess.",
              int(vertexIndices.size()), int(vertexIndices.size() % 4));
        while ((vertexIndices.size() % 4) != 0u)
            vertexIndices.pop_back();
    }

    if (P.empty()) {
        Error(loc, "Vertex positions \"P\" must be provided with bilinear "
                   "patch mesh shape.");
        return {};
    }

    if (!uv.empty() && uv.size() != P.size()) {
        Error(loc, "Number of \"uv\"s for bilinear patch mesh must match \"P\"s. "
                   "Discarding uvs.");
        uv = {};
    }

    std::vector<Normal3f> N = parameters.GetNormal3fArray("N");
    if (!N.empty() && N.size() != P.size()) {
        Error(loc, "Number of \"N\"s for bilinear patch mesh must match \"P\"s. "
                   "Discarding \"N\"s.");
        N = {};
    }

    for (size_t i = 0; i < vertexIndices.size(); ++i)
        if (vertexIndices[i] >= P.size()) {
            Error(loc,
                  "Bilinear patch mesh has out of-bounds vertex index %d (%d "
                  "\"P\" "
                  "values were given. Discarding this mesh.",
                  vertexIndices[i], (int)P.size());
            return {};
        }

    std::vector<int> faceIndices = parameters.GetIntArray("faceIndices");
    if (!faceIndices.empty() && faceIndices.size() != vertexIndices.size() / 4) {
        Error(loc,
              "Number of face indices %d does not match number of bilinear "
              "patches %d. "
              "Discarding face indices.",
              int(faceIndices.size()), int(vertexIndices.size() / 4));
        faceIndices = {};
    }

    // Grab this before the vertexIndices are std::moved...
    size_t nBlps = vertexIndices.size() / 4;

    std::string filename =
        ResolveFilename(parameters.GetOneString("emissionfilename", ""));
    PiecewiseConstant2D *imageDist = nullptr;
    if (!filename.empty()) {
        ImageAndMetadata im = Image::Read(filename, alloc);
        Bounds2f domain = Bounds2f(Point2f(0, 0), Point2f(1, 1));
        Array2D<Float> d = im.image.GetSamplingDistribution();
        imageDist = alloc.new_object<PiecewiseConstant2D>(d, domain, alloc);
    }

    return alloc.new_object<BilinearPatchMesh>(
        *renderFromObject, reverseOrientation, std::move(vertexIndices), std::move(P),
        std::move(N), std::move(uv), std::move(faceIndices), imageDist);
}